

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLCellABecLap.cpp
# Opt level: O2

void __thiscall
amrex::MLCellABecLap::getFluxes
          (MLCellABecLap *this,
          Vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
          *a_flux,Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *a_sol,
          Location a_loc)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  double extraout_XMM0_Qa;
  double val;
  
  (*(this->super_MLCellLinOp).super_MLLinOp._vptr_MLLinOp[0x4c])();
  val = 1.0 / extraout_XMM0_Qa;
  uVar1 = (this->super_MLCellLinOp).super_MLLinOp.m_num_amr_levels;
  uVar6 = 0;
  uVar2 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar2 = uVar6;
  }
  for (uVar5 = 0; uVar5 != uVar2; uVar5 = uVar5 + 1) {
    (*(this->super_MLCellLinOp).super_MLLinOp._vptr_MLLinOp[0x13])
              (this,uVar5 & 0xffffffff,
               (a_flux->
               super_vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
               ).
               super__Vector_base<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar5,
               (a_sol->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
               super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
               super__Vector_impl_data._M_start[uVar5],(ulong)a_loc);
    lVar4 = 3;
    uVar3 = uVar6;
    while (bVar7 = lVar4 != 0, lVar4 = lVar4 + -1, bVar7) {
      MLCellLinOp::unapplyMetricTerm
                (&this->super_MLCellLinOp,(int)uVar5,0,
                 *(MultiFab **)
                  ((long)((a_flux->
                          super_vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
                          ).
                          super__Vector_base<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_elems + uVar3));
      if ((val != 1.0) || (NAN(val))) {
        MultiFab::mult(*(MultiFab **)
                        ((long)((a_flux->
                                super_vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
                                ).
                                super__Vector_base<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_elems + uVar3),val,0)
        ;
      }
      uVar3 = uVar3 + 8;
    }
    uVar6 = uVar6 + 0x18;
  }
  return;
}

Assistant:

void
MLCellABecLap::getFluxes (const Vector<Array<MultiFab*,AMREX_SPACEDIM> >& a_flux,
                          const Vector<MultiFab*>& a_sol,
                          Location a_loc) const
{
    BL_PROFILE("MLMG::getFluxes()");

    const Real betainv = Real(1.0) / getBScalar();
    const int nlevs = NAMRLevels();
    for (int alev = 0; alev < nlevs; ++alev) {
        compFlux(alev, a_flux[alev], *a_sol[alev], a_loc);
        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
            unapplyMetricTerm(alev, 0, *a_flux[alev][idim]);
            if (betainv != Real(1.0)) {
                a_flux[alev][idim]->mult(betainv);
            }
        }
    }
}